

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::verifyTimestamp
          (TestStatus *__return_storage_ptr__,TimestampTestInstance *this)

{
  long lVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  long *local_60;
  long local_58;
  long local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  bVar9 = (this->m_stages).
          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->m_stages).
          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (bVar9) {
    local_38 = (string *)&__return_storage_ptr__->m_description;
    local_40 = &(__return_storage_ptr__->m_description).field_2;
    uVar7 = 0;
    iVar8 = -1;
    do {
      uVar6 = (uint)uVar7;
      bVar10 = uVar6 != 0;
      if (bVar10) {
        puVar2 = this->m_timestampValues;
        if (*puVar2 <= puVar2[uVar7]) {
          lVar5 = 0;
          do {
            if (iVar8 == (int)lVar5) goto LAB_0049c999;
            lVar1 = lVar5 + 1;
            lVar3 = lVar5 + 1;
            lVar5 = lVar1;
          } while (puVar2[lVar3] <= puVar2[uVar7]);
          bVar10 = (uint)lVar1 < uVar6;
        }
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "Latter stage timestamp is smaller than the former stage timestamp.","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_40;
        std::__cxx11::string::_M_construct<char*>(local_38,local_60,local_58 + (long)local_60);
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        if (bVar10) {
          if (bVar9) {
            return __return_storage_ptr__;
          }
          break;
        }
      }
LAB_0049c999:
      uVar7 = (ulong)(uVar6 + 1);
      uVar4 = (long)(this->m_stages).
                    super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_stages).
                    super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2;
      iVar8 = iVar8 + 1;
      bVar9 = uVar7 < uVar4;
    } while (uVar7 < uVar4);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Timestamp increases steadily.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_60,local_58 + (long)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TimestampTestInstance::verifyTimestamp(void)
{
	for (deUint32 first = 0; first < m_stages.size(); first++)
	{
		for (deUint32 second = 0; second < first; second++)
		{
			if(m_timestampValues[first] < m_timestampValues[second])
			{
				return tcu::TestStatus::fail("Latter stage timestamp is smaller than the former stage timestamp.");
			}
		}
	}

	return tcu::TestStatus::pass("Timestamp increases steadily.");
}